

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

Gia_StaAre_t * Gia_ManAreCreateStaNew(Gia_ManAre_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_StaAre_t *p_01;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_StaAre_t *pSta;
  Gia_ManAre_t *p_local;
  
  p_01 = Gia_ManAreCreateSta(p);
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p->pAig);
    bVar2 = false;
    if (local_24 < iVar1) {
      p_00 = p->pAig;
      iVar1 = Gia_ManPoNum(p->pAig);
      pGStack_20 = Gia_ManCo(p_00,iVar1 + local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (pGStack_20->Value == 0) {
      Gia_StaSetValue0(p_01,local_24);
    }
    else if (pGStack_20->Value == 1) {
      Gia_StaSetValue1(p_01,local_24);
    }
    local_24 = local_24 + 1;
  }
  return p_01;
}

Assistant:

static inline Gia_StaAre_t * Gia_ManAreCreateStaNew( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i;
    pSta = Gia_ManAreCreateSta( p );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( pObj->Value == 0 )
            Gia_StaSetValue0( pSta, i );
        else if ( pObj->Value == 1 )
            Gia_StaSetValue1( pSta, i );
    }
    return pSta;
}